

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

VisitReturn __thiscall
QMakeEvaluator::evaluateConditional(QMakeEvaluator *this,QStringView cond,QString *where,int line)

{
  VisitReturn VVar1;
  ProFile *pro;
  char16_t *tokPtr;
  value_type vVar2;
  
  VVar1 = ReturnFalse;
  pro = QMakeParser::parsedProBlock(this->m_parser,cond,0,where,line,TestGrammar);
  if (pro->m_ok == true) {
    QList<QMakeEvaluator::Location>::emplaceBack<QMakeEvaluator::Location_const&>
              (&(this->m_locationStack).super_QList<QMakeEvaluator::Location>,&this->m_current);
    tokPtr = (pro->m_proitems).d.ptr;
    if (tokPtr == (char16_t *)0x0) {
      tokPtr = (char16_t *)&QString::_empty;
    }
    VVar1 = visitProBlock(this,pro,(ushort *)tokPtr);
    vVar2 = QList<QMakeEvaluator::Location>::takeLast
                      (&(this->m_locationStack).super_QList<QMakeEvaluator::Location>);
    (this->m_current).pro = vVar2.pro;
    (this->m_current).line = vVar2.line;
  }
  ProFile::deref(pro);
  return VVar1;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateConditional(
        QStringView cond, const QString &where, int line)
{
    VisitReturn ret = ReturnFalse;
    ProFile *pro = m_parser->parsedProBlock(cond, 0, where, line, QMakeParser::TestGrammar);
    if (pro->isOk()) {
        m_locationStack.push(m_current);
        ret = visitProBlock(pro, pro->tokPtr());
        m_current = m_locationStack.pop();
    }
    pro->deref();
    return ret;
}